

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  undefined2 uVar1;
  undefined2 uVar2;
  LodePNGColorType LVar3;
  byte bVar4;
  byte bVar5;
  uchar a_00;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  LodePNGColorProfile *pLVar13;
  size_t sVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  byte local_115;
  uchar local_114;
  byte local_113;
  byte local_112;
  byte local_111;
  LodePNGColorMode *local_110;
  size_t local_108;
  LodePNGColorProfile *local_100;
  uchar *local_f8;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  size_t local_d8;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  ulong local_c0;
  ColorTree tree;
  
  local_108 = (ulong)h * (ulong)w;
  LVar3 = mode_in->colortype;
  local_f8 = in;
  uVar6 = lodepng_can_have_alpha(mode_in);
  uVar6 = uVar6 ^ 1;
  local_110 = mode_in;
  local_dc = lodepng_get_bpp(mode_in);
  uVar9 = profile->bits;
  local_d8 = CONCAT71(local_d8._1_7_,local_dc == 1 && uVar9 == 1);
  local_cc = 0x101;
  if ((local_dc < 9) &&
     (local_cc = (1 << ((byte)local_dc & 0x1f)) + profile->numcolors, 0x100 < local_cc)) {
    local_cc = 0x101;
  }
  profile->numpixels = profile->numpixels + local_108;
  color_tree_init(&tree);
  if (profile->alpha != 0) {
    uVar6 = 1;
  }
  uVar11 = profile->colored;
  local_115 = local_dc <= uVar9;
  uVar12 = profile->numcolors;
  local_c0 = (ulong)uVar12;
  bVar16 = local_cc <= uVar12 || uVar9 == 0x10;
  local_100 = profile;
  if (local_cc > uVar12 && uVar9 != 0x10) {
    for (uVar15 = 0; uVar15 < local_c0; uVar15 = uVar15 + 1) {
      color_tree_add(&tree,profile->palette[uVar15 * 4],profile->palette[uVar15 * 4 + 1],
                     profile->palette[uVar15 * 4 + 2],profile->palette[uVar15 * 4 + 3],(uint)uVar15)
      ;
      local_c0 = (ulong)profile->numcolors;
    }
  }
  uVar9 = (uint)(uVar11 != 0 || (LVar3 & ~LCT_GREY_ALPHA) == LCT_GREY);
  if (local_110->bitdepth == 0x10) {
    sVar14 = 0;
    do {
      if (local_108 == sVar14) goto LAB_0010742a;
      getPixelColorRGBA16(&r,&g,&b,&a,local_f8,sVar14,local_110);
      pLVar13 = local_100;
    } while ((((r & 0xff) == r >> 8) && ((g & 0xff) == g >> 8)) &&
            (((b & 0xff) == b >> 8 && (sVar14 = sVar14 + 1, (a & 0xff) == a >> 8))));
    local_100->bits = 0x10;
    r = 0;
    g = 0;
    b = 0;
    a = 0;
    sVar14 = 0;
    do {
      if (local_108 == sVar14) break;
      getPixelColorRGBA16(&r,&g,&b,&a,local_f8,sVar14,local_110);
      bVar5 = 1;
      bVar16 = uVar9 == 0;
      uVar9 = 1;
      if (bVar16) {
        if (r == g) {
          bVar5 = 0;
          uVar9 = 0;
          if (r == b) goto LAB_001072d0;
        }
        pLVar13->colored = 1;
        bVar5 = 1;
        uVar9 = 1;
      }
LAB_001072d0:
      if (uVar6 == 0) {
        if ((r == pLVar13->key_r) && (g == pLVar13->key_g)) {
          bVar16 = b == pLVar13->key_b;
        }
        else {
          bVar16 = false;
        }
        if (a == 0xffff) {
          bVar4 = 0;
          uVar6 = 0;
          if ((bool)(pLVar13->key != 0 & bVar16)) goto LAB_00107373;
        }
        else {
          if ((a != 0) || (!(bool)(pLVar13->key == 0 | bVar16))) {
LAB_00107373:
            pLVar13->alpha = 1;
            pLVar13->key = 0;
            goto LAB_00107382;
          }
          bVar4 = 0;
          uVar6 = 0;
          if (pLVar13->key == 0 && pLVar13->alpha == 0) {
            pLVar13->key = 1;
            pLVar13->key_r = r;
            pLVar13->key_g = g;
            pLVar13->key_b = b;
            bVar4 = 0;
            uVar6 = 0;
          }
        }
      }
      else {
LAB_00107382:
        bVar4 = 1;
        uVar6 = 1;
      }
      sVar14 = sVar14 + 1;
    } while (!(bool)(bVar5 & bVar4));
    if ((pLVar13->key != 0) && (pLVar13->alpha == 0)) {
      for (sVar14 = 0; local_108 != sVar14; sVar14 = sVar14 + 1) {
        getPixelColorRGBA16(&r,&g,&b,&a,local_f8,sVar14,local_110);
        if ((((a != 0) && (r == pLVar13->key_r)) && (g == pLVar13->key_g)) && (b == pLVar13->key_b))
        {
          pLVar13->alpha = 1;
          pLVar13->key = 0;
        }
      }
    }
  }
  else {
LAB_0010742a:
    local_115 = local_115 | (byte)local_d8;
    sVar14 = 0;
    r = r & 0xff00;
    g = g & 0xff00;
    b = b & 0xff00;
    a = a & 0xff00;
    pLVar13 = local_100;
    do {
      uVar11 = local_dc;
      if (local_108 == sVar14) break;
      local_d8 = sVar14;
      getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_f8,sVar14,local_110);
      uVar12 = pLVar13->bits;
      if ((local_115 & 1) == 0 && uVar12 < 8) {
        uVar7 = 1;
        if ((1 < (byte)((byte)r + 1)) && (uVar7 = 8, (byte)r % 0x11 == 0)) {
          uVar7 = (uint)((byte)r % 0x55 != 0) * 2 + 2;
        }
        if (uVar12 < uVar7) {
          pLVar13->bits = uVar7;
          uVar12 = uVar7;
        }
      }
      local_115 = uVar11 <= uVar12;
      uVar15 = CONCAT71((int7)(sVar14 >> 8),1);
      bVar10 = 1;
      uVar11 = 1;
      bVar4 = (byte)g;
      bVar5 = (byte)b;
      uVar7 = uVar12;
      if (uVar9 == 0) {
        if ((byte)r == (byte)g) {
          bVar10 = 0;
          uVar11 = 0;
          if ((byte)r == (byte)b) goto LAB_0010755f;
        }
        pLVar13->colored = 1;
        bVar10 = 1;
        uVar11 = 1;
        if (uVar12 < 8) {
          pLVar13->bits = 8;
          uVar7 = 8;
          bVar10 = 1;
        }
      }
LAB_0010755f:
      a_00 = (uchar)a;
      if (uVar6 == 0) {
        if ((pLVar13->key_r == (r & 0xff)) && (pLVar13->key_g == (g & 0xff))) {
          bVar17 = pLVar13->key_b == (b & 0xff);
        }
        else {
          bVar17 = false;
        }
        if ((uchar)a == 0xff) {
          uVar15 = 0;
          uVar6 = 0;
          if ((bool)(pLVar13->key != 0 & bVar17)) {
            pLVar13->alpha = 1;
            pLVar13->key = 0;
            if (uVar7 < 8) goto LAB_0010776f;
            goto LAB_00107564;
          }
        }
        else {
          if (((uchar)a != '\0') || (!(bool)(pLVar13->key == 0 | bVar17))) {
            pLVar13->alpha = 1;
            pLVar13->key = 0;
            if (uVar7 < 8) {
LAB_0010776f:
              pLVar13->bits = 8;
              goto LAB_00107564;
            }
            goto LAB_00107567;
          }
          uVar15 = 0;
          uVar6 = 0;
          if (pLVar13->key == 0 && pLVar13->alpha == 0) {
            pLVar13->key = 1;
            pLVar13->key_r = r & 0xff;
            pLVar13->key_g = g & 0xff;
            pLVar13->key_b = b & 0xff;
            uVar15 = 0;
            uVar6 = 0;
          }
        }
      }
      else {
LAB_00107564:
        uVar15 = CONCAT71((int7)(uVar15 >> 8),1);
LAB_00107567:
        uVar6 = 1;
      }
      if (bVar16) {
        bVar16 = true;
        uVar9 = uVar11;
      }
      else {
        local_e8 = (uint)uVar15;
        local_111 = (byte)r;
        local_c8 = (uint)(byte)g;
        local_c4 = (uint)(byte)r;
        local_ec = uVar12;
        local_e4 = uVar6;
        local_e0 = uVar11;
        iVar8 = color_tree_get(&tree,(byte)r,(byte)g,(byte)b,(uchar)a);
        bVar16 = false;
        if (iVar8 < 0) {
          local_114 = a_00;
          local_113 = bVar5;
          local_112 = bVar4;
          color_tree_add(&tree,(uchar)local_c4,(uchar)local_c8,bVar5,a_00,(uint)local_c0);
          uVar9 = local_100->numcolors;
          if ((ulong)uVar9 < 0x100) {
            uVar15 = (ulong)(uVar9 * 4);
            local_100->palette[(ulong)uVar9 * 4] = local_111;
            local_100->palette[uVar15 + 1] = local_112;
            local_100->palette[uVar15 + 2] = local_113;
            local_100->palette[uVar15 + 3] = local_114;
          }
          uVar9 = uVar9 + 1;
          local_c0 = (ulong)uVar9;
          local_100->numcolors = uVar9;
          bVar16 = local_cc <= uVar9;
        }
        uVar15 = (ulong)local_e8;
        pLVar13 = local_100;
        uVar12 = local_ec;
        uVar6 = local_e4;
        uVar9 = local_e0;
      }
      sVar14 = local_d8 + 1;
    } while (((bVar10 & (byte)uVar15 & bVar16) != 1) || (uVar12 < local_dc));
    if ((pLVar13->key != 0) && (pLVar13->alpha == 0)) {
      for (sVar14 = 0; local_108 != sVar14; sVar14 = sVar14 + 1) {
        getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_f8,sVar14,local_110
                          );
        if (((((uchar)a != '\0') && (pLVar13->key_r == (r & 0xff))) &&
            (pLVar13->key_g == (g & 0xff))) && (pLVar13->key_b == (b & 0xff))) {
          pLVar13->alpha = 1;
          pLVar13->key = 0;
          if (pLVar13->bits < 8) {
            pLVar13->bits = 8;
          }
        }
      }
    }
    uVar1 = pLVar13->key_r;
    uVar2 = pLVar13->key_g;
    pLVar13->key_r = uVar1 * 0x101;
    pLVar13->key_g = uVar2 * 0x101;
    pLVar13->key_b = (short)*(undefined4 *)&pLVar13->key_b * 0x101;
  }
  color_tree_cleanup(&tree);
  return 0;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode_in)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (profile->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if(bpp <= 8) maxnumcolors = LODEPNG_MIN(257, profile->numcolors + (1 << bpp));

  profile->numpixels += numpixels;

  color_tree_init(&tree);

  /*If the profile was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if(profile->alpha) alpha_done = 1;
  if(profile->colored) colored_done = 1;
  if(profile->bits == 16) numcolors_done = 1;
  if(profile->bits >= bpp) bits_done = 1;
  if(profile->numcolors >= maxnumcolors) numcolors_done = 1;

  if(!numcolors_done)
  {
    for(i = 0; i < profile->numcolors; i++)
    {
      const unsigned char* color = &profile->palette[i * 4];
      color_tree_add(&tree, color[0], color[1], color[2], color[3], i);
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode_in->bitdepth == 16 && !sixteen)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        profile->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}